

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::GenerateMembersHeader
          (ExtensionGenerator *this,Printer *printer)

{
  long *plVar1;
  bool bVar2;
  long *plVar3;
  long lVar4;
  string_view name;
  anon_class_1_0_00000001 local_4b9;
  undefined1 *local_4b8;
  undefined8 local_4b0;
  undefined1 local_4a8;
  undefined7 uStack_4a7;
  undefined8 uStack_4a0;
  string local_498;
  Printer *local_478;
  string local_470;
  string local_450;
  string local_430;
  char *local_410;
  AnnotationRecord local_408;
  Sub local_3c8;
  Sub local_310;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  long *local_238;
  undefined8 uStack_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  Sub local_1a0;
  Sub local_e8;
  
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  local_478 = printer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"method_name","");
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_3c8,&local_498,&this->method_name_);
  io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::FieldDescriptor,_0>
            (&local_408,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  io::Printer::Sub::AnnotatedAs(&local_310,&local_3c8,&local_408);
  local_4b8 = &local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"comments","");
  local_258 = local_248;
  if (local_4b8 == &local_4a8) {
    uStack_240 = uStack_4a0;
  }
  else {
    local_258 = local_4b8;
  }
  local_250 = local_4b0;
  local_4b0 = 0;
  local_4a8 = 0;
  local_4b8 = &local_4a8;
  local_238 = (long *)operator_new(0x18);
  *local_238 = (long)&local_478;
  local_238[1] = (long)this;
  *(undefined1 *)(local_238 + 2) = 0;
  local_220 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_230 = 0;
  local_228 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_218 = 1;
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x53a374);
  local_1a8 = 0;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"storage_attribute","");
  name._M_str = (this->method_name_)._M_dataplus._M_p;
  name._M_len = (this->method_name_)._M_string_length;
  bVar2 = IsRetainedName(name);
  local_410 = "";
  if (bVar2) {
    local_410 = "NS_RETURNS_NOT_RETAINED";
  }
  io::Printer::Sub::Sub<char_const*>(&local_1a0,&local_430,&local_410);
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"deprecated_attribute","");
  GetOptionalDeprecatedAttribute<google::protobuf::FieldDescriptor>
            (&local_470,this->descriptor_,this->descriptor_->file_);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_e8,&local_450,&local_470);
  io::Printer::Emit(printer,&local_310,4,0x78,
                    "\n        $comments$\n        + (GPBExtensionDescriptor *)$method_name$$ storage_attribute$$ deprecated_attribute$;\n      "
                   );
  lVar4 = 0x2e0;
  do {
    if ((&local_3c8.annotation_.
          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
          _M_payload.
          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
          .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged)
        [lVar4] == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 ((long)&local_3c8.annotation_.
                         super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>
                         ._M_payload.
                         super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
                         .
                         super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>
                         ._M_payload + lVar4));
    }
    plVar3 = (long *)(local_3c8.value_.consume_after.field_2._M_local_buf + lVar4);
    plVar1 = *(long **)((long)&local_3c8.value_.consume_after._M_dataplus._M_p + lVar4);
    if (plVar3 != plVar1) {
      operator_delete(plVar1,*plVar3 + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr
      [(&local_3c8.value_.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         _M_index)[lVar4]]._M_data)
              (&local_4b9,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)((long)&local_3c8.value_.value.
                          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          .
                          super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          ._M_u + lVar4));
    plVar3 = (long *)(local_3c8.key_.field_2._M_local_buf + lVar4);
    (&local_3c8.value_.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      _M_index)[lVar4] = 0xff;
    plVar1 = *(long **)((long)&local_3c8.key_._M_dataplus._M_p + lVar4);
    if (plVar3 != plVar1) {
      operator_delete(plVar1,*plVar3 + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,CONCAT71(uStack_4a7,local_4a8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.file_path._M_dataplus._M_p != &local_408.file_path.field_2) {
    operator_delete(local_408.file_path._M_dataplus._M_p,
                    local_408.file_path.field_2._M_allocated_capacity + 1);
  }
  if (local_408.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_408.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3c8.annotation_.
      super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload
      .super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
      true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               &local_3c8.annotation_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.value_.consume_after._M_dataplus._M_p != &local_3c8.value_.consume_after.field_2)
  {
    operator_delete(local_3c8.value_.consume_after._M_dataplus._M_p,
                    local_3c8.value_.consume_after.field_2._M_allocated_capacity + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr
    [local_3c8.value_.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
     _M_index]._M_data)((anon_class_1_0_00000001 *)&local_470,&local_3c8.value_.value);
  local_3c8.value_.value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>._M_index =
       0xff;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.key_._M_dataplus._M_p != &local_3c8.key_.field_2) {
    operator_delete(local_3c8.key_._M_dataplus._M_p,local_3c8.key_.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ExtensionGenerator::GenerateMembersHeader(io::Printer* printer) const {
  printer->Emit(
      {Sub("method_name", method_name_).AnnotatedAs(descriptor_),
       {"comments",
        [&] { EmitCommentsString(printer, generation_options_, descriptor_); }},
       {"storage_attribute",
        IsRetainedName(method_name_) ? "NS_RETURNS_NOT_RETAINED" : ""},
       {"deprecated_attribute",
        // Unlike normal message fields, check if the file for the extension was
        // deprecated.
        GetOptionalDeprecatedAttribute(descriptor_, descriptor_->file())}},
      R"objc(
        $comments$
        + (GPBExtensionDescriptor *)$method_name$$ storage_attribute$$ deprecated_attribute$;
      )objc");
}